

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_inquisitor.cpp
# Opt level: O3

bool InquisitorCheckDistance(AActor *self)

{
  bool bVar1;
  AActor *pAVar2;
  double dVar3;
  
  if (self->reactiontime != 0) {
    return false;
  }
  pAVar2 = (self->target).field_0.p;
  if (pAVar2 == (AActor *)0x0) {
LAB_005efb4f:
    pAVar2 = (AActor *)0x0;
  }
  else if (((pAVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (self->target).field_0.p = (AActor *)0x0;
    goto LAB_005efb4f;
  }
  bVar1 = P_CheckSight(self,pAVar2,0);
  if (!bVar1) {
    return false;
  }
  pAVar2 = (self->target).field_0.p;
  if (pAVar2 != (AActor *)0x0) {
    if (((pAVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_005efb80;
    (self->target).field_0.p = (AActor *)0x0;
  }
  pAVar2 = (AActor *)0x0;
LAB_005efb80:
  dVar3 = AActor::Distance2D(self,pAVar2,false);
  return dVar3 < 264.0;
}

Assistant:

bool InquisitorCheckDistance (AActor *self)
{
	if (self->reactiontime == 0 && P_CheckSight (self, self->target))
	{
		return self->Distance2D (self->target) < 264.;
	}
	return false;
}